

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseLambdaCall(Parser *this,bool lParenSkipped)

{
  Mark MVar1;
  Mark *pMVar2;
  Token *pTVar3;
  int in_EDX;
  undefined7 in_register_00000031;
  Tokenizer *this_00;
  _Head_base<0UL,_ExpressionNode_*,_false> _Var4;
  undefined1 local_b0 [8];
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  Token token;
  _Head_base<0UL,_ExpressionNode_*,_false> local_50;
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  local_48;
  
  this_00 = (Tokenizer *)CONCAT71(in_register_00000031,lParenSkipped);
  pMVar2 = Stream::getMark((Stream *)this_00);
  MVar1 = *pMVar2;
  if (in_EDX == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&token,"Expected open parenthesis!",(allocator<char> *)&arguments);
    expectToken((Parser *)this_00,LParen,(string *)&token);
    std::__cxx11::string::~string((string *)&token);
  }
  parseLambda((Parser *)local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&token,"Expected closing parenthesis!",(allocator<char> *)&arguments);
  expectToken((Parser *)this_00,RParen,(string *)&token);
  std::__cxx11::string::~string((string *)&token);
  parseCallArgumentList_abi_cxx11_(&arguments,(Parser *)this_00);
  std::
  make_unique<LambdaCallNode,std::unique_ptr<LambdaNode,std::default_delete<LambdaNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
            ((unique_ptr<LambdaNode,_std::default_delete<LambdaNode>_> *)&token,
             (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)local_b0);
  _Var4._M_head_impl = (ExpressionNode *)CONCAT44(token._4_4_,token.type);
  (this->tokenizer_).stream_.is_ = (istream *)_Var4._M_head_impl;
  pTVar3 = Tokenizer::peek(this_00);
  Token::Token(&token,pTVar3);
  while (token.type == LParen) {
    parseCallArgumentList_abi_cxx11_
              ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)&local_48,(Parser *)this_00);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    _M_move_assign(&arguments,&local_48);
    std::__cxx11::
    _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    _M_clear(&local_48);
    (this->tokenizer_).stream_.is_ = (istream *)0x0;
    local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)_Var4._M_head_impl;
    std::
    make_unique<FunctionResultCallNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
              ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)&local_50,
               (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)&local_48);
    _Var4._M_head_impl = local_50._M_head_impl;
    (this->tokenizer_).stream_.is_ = (istream *)local_50._M_head_impl;
    pTVar3 = Tokenizer::peek(this_00);
    Token::operator=(&token,pTVar3);
    if (local_48._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_48._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  ((_List_node_base *)_Var4._M_head_impl)->_M_prev = (_List_node_base *)MVar1;
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&token.value);
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear(&arguments.
            super__List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
          );
  if (local_b0 != (undefined1  [8])0x0) {
    (*(code *)(*(_List_node_base **)local_b0)->_M_prev)();
  }
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseLambdaCall(bool lParenSkipped)
{
  const auto mark = tokenizer_.getMark();
  if(!lParenSkipped)
    expectToken(TokenType::LParen, "Expected open parenthesis!");
  
  auto lambda = parseLambda();
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<LambdaCallNode>(std::move(lambda), std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }
  node->setMark(mark);
  return node;
}